

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

TRef fwd_ahload(jit_State *J,IRRef xref)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  TRef TVar4;
  IRIns *pIVar5;
  long lVar6;
  long lVar7;
  jit_State *J_00;
  cTValue *pcVar8;
  ushort *puVar9;
  uint in_ESI;
  long in_RDI;
  IRIns *load;
  IRIns *key_1;
  cTValue *tv;
  TValue keyv;
  IRIns *store_1;
  IRIns *key;
  IRIns *newref;
  IRRef ref2;
  IRRef tab;
  IRIns *ir;
  IRIns *store;
  IRRef ref;
  IRRef lim;
  IRIns *xr;
  uint64_t in_stack_ffffffffffffff48;
  IRRef in_stack_ffffffffffffff50;
  AliasRet in_stack_ffffffffffffff54;
  IRIns *ir_00;
  undefined4 in_stack_ffffffffffffff60;
  AliasRet in_stack_ffffffffffffff64;
  GCobj *in_stack_ffffffffffffff68;
  IRIns *in_stack_ffffffffffffff78;
  IRIns *in_stack_ffffffffffffff80;
  jit_State *in_stack_ffffffffffffff88;
  ushort *local_70;
  uint local_60;
  uint local_48;
  uint local_44;
  uint local_14;
  uint local_4;
  
  pIVar5 = (IRIns *)(*(long *)(in_RDI + 0x10) + (ulong)in_ESI * 8);
  uVar1 = *(ushort *)(in_RDI + 0x182 + (long)(int)(*(byte *)(in_RDI + 0xa5) + 7) * 2);
  while (local_48 = (uint)uVar1, in_ESI < local_48) {
    lVar6 = *(long *)(in_RDI + 0x10) + (ulong)local_48 * 8;
    in_stack_ffffffffffffff64 =
         aa_ahref(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (in_stack_ffffffffffffff64 != ALIAS_NO) {
      if (in_stack_ffffffffffffff64 == ALIAS_MAY) {
        local_44 = local_48;
        goto LAB_001998f6;
      }
      if (in_stack_ffffffffffffff64 == ALIAS_MUST) {
        return (uint)*(ushort *)(lVar6 + 2);
      }
    }
    uVar1 = *(ushort *)(lVar6 + 6);
  }
  if (((pIVar5->field_1).o == '9') || (ir_00 = pIVar5, (pIVar5->field_1).o == '8')) {
    ir_00 = (IRIns *)(*(long *)(in_RDI + 0x10) +
                     (ulong)(ushort)(((GCtrace *)&(pIVar5->field_0).op1)->nextgc).gcptr32 * 8);
  }
  uVar2 = (uint)(ushort)(((GCtrace *)&(ir_00->field_0).op1)->nextgc).gcptr32;
  lVar6 = *(long *)(in_RDI + 0x10) + (ulong)uVar2 * 8;
  local_44 = in_ESI;
  if (((*(char *)(lVar6 + 5) == 'O') ||
      ((*(char *)(lVar6 + 5) == 'P' && ((pIVar5->field_0).op2 < 0x8000)))) &&
     (iVar3 = fwd_aa_tab_clear((jit_State *)&ir_00->field_0,in_stack_ffffffffffffff54,
                               in_stack_ffffffffffffff50), iVar3 != 0)) {
    if ((pIVar5->field_1).o == '8') {
      uVar1 = *(ushort *)(in_RDI + 0x1f8);
      while (local_60 = (uint)uVar1, uVar2 < local_60) {
        lVar7 = *(long *)(in_RDI + 0x10) + (ulong)local_60 * 8;
        if ((*(byte *)(*(long *)(in_RDI + 0x10) + 4 + (ulong)*(ushort *)(lVar7 + 2) * 8) & 0x1f) ==
            0xe) goto LAB_001998f6;
        uVar1 = *(ushort *)(lVar7 + 6);
      }
    }
    else {
      local_70 = (ushort *)(*(long *)(in_RDI + 0x10) + (ulong)(pIVar5->field_0).op2 * 8);
      if (*(char *)((long)local_70 + 5) == '\x1e') {
        local_70 = (ushort *)(*(long *)(in_RDI + 0x10) + (ulong)*local_70 * 8);
      }
      if (((local_70[2] & 0x1f) == 0xe) && (uVar2 < *(ushort *)(in_RDI + 0x1f8))) goto LAB_001998f6;
    }
    while (uVar2 < local_48) {
      in_stack_ffffffffffffff88 = (jit_State *)(*(long *)(in_RDI + 0x10) + (ulong)local_48 * 8);
      in_stack_ffffffffffffff54 =
           aa_ahref(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      if (in_stack_ffffffffffffff54 != ALIAS_NO) {
        if (in_stack_ffffffffffffff54 == ALIAS_MAY) goto LAB_001998f6;
        if (in_stack_ffffffffffffff54 == ALIAS_MUST) {
          return (uint)*(ushort *)((long)&(in_stack_ffffffffffffff88->cur).nextgc.gcptr32 + 2);
        }
      }
      local_48 = (uint)(in_stack_ffffffffffffff88->cur).nsnap;
    }
    if (*(char *)(lVar6 + 5) == 'O') {
      return 0x7fff;
    }
    J_00 = (jit_State *)(*(long *)(in_RDI + 0x10) + (ulong)(pIVar5->field_0).op2 * 8);
    if ((J_00->cur).gct == '\x1e') {
      J_00 = (jit_State *)(*(long *)(in_RDI + 0x10) + (ulong)(ushort)(J_00->cur).nextgc.gcptr32 * 8)
      ;
    }
    lj_ir_kvalue(&in_stack_ffffffffffffff68->th,
                 (TValue *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),ir_00);
    pcVar8 = lj_tab_get((lua_State *)in_stack_ffffffffffffff88,
                        (GCtab *)&in_stack_ffffffffffffff80->field_0,
                        (cTValue *)in_stack_ffffffffffffff78);
    if (0xfffffffc < (pcVar8->field_2).it) {
      if ((pcVar8->field_2).it < 0xfffeffff) {
        local_4 = 0xe;
      }
      else if ((int)(pcVar8->field_2).it >> 0xf == -2) {
        local_4 = 3;
      }
      else {
        local_4 = (pcVar8->field_2).it ^ 0xffffffff;
      }
      if ((pcVar8->field_2).it < 0xfffeffff) {
        local_14 = 0xe;
      }
      else if ((int)(pcVar8->field_2).it >> 0xf == -2) {
        local_14 = 3;
      }
      else {
        local_14 = (pcVar8->field_2).it ^ 0xffffffff;
      }
      return (0x7fff - local_4) + local_14 * 0x1000000;
    }
    if ((pcVar8->field_2).it < 0xfffeffff) {
      TVar4 = lj_ir_knum_u64((jit_State *)
                             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                             in_stack_ffffffffffffff48);
      return TVar4;
    }
    if (0xfffffff6 < (pcVar8->field_2).it + 4) {
      TVar4 = lj_ir_kgc(J_00,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
      return TVar4;
    }
  }
LAB_001998f6:
  uVar1 = *(ushort *)(in_RDI + 0x182 + (ulong)*(byte *)(in_RDI + 0xa5) * 2);
  while( true ) {
    local_48 = (uint)uVar1;
    if (local_48 <= local_44) {
      return 0;
    }
    puVar9 = (ushort *)(*(long *)(in_RDI + 0x10) + (ulong)local_48 * 8);
    if (*puVar9 == in_ESI) break;
    uVar1 = puVar9[3];
  }
  return local_48;
}

Assistant:

static TRef fwd_ahload(jit_State *J, IRRef xref)
{
  IRIns *xr = IR(xref);
  IRRef lim = xref;  /* Search limit. */
  IRRef ref;

  /* Search for conflicting stores. */
  ref = J->chain[fins->o+IRDELTA_L2S];
  while (ref > xref) {
    IRIns *store = IR(ref);
    switch (aa_ahref(J, xr, IR(store->op1))) {
    case ALIAS_NO:   break;  /* Continue searching. */
    case ALIAS_MAY:  lim = ref; goto cselim;  /* Limit search for load. */
    case ALIAS_MUST: return store->op2;  /* Store forwarding. */
    }
    ref = store->prev;
  }

  /* No conflicting store (yet): const-fold loads from allocations. */
  {
    IRIns *ir = (xr->o == IR_HREFK || xr->o == IR_AREF) ? IR(xr->op1) : xr;
    IRRef tab = ir->op1;
    ir = IR(tab);
    if ((ir->o == IR_TNEW || (ir->o == IR_TDUP && irref_isk(xr->op2))) &&
	fwd_aa_tab_clear(J, tab, tab)) {
      /* A NEWREF with a number key may end up pointing to the array part.
      ** But it's referenced from HSTORE and not found in the ASTORE chain.
      ** Or a NEWREF may rehash the table and move unrelated number keys.
      ** For now simply consider this a conflict without forwarding anything.
      */
      if (xr->o == IR_AREF) {
	IRRef ref2 = J->chain[IR_NEWREF];
	while (ref2 > tab) {
	  IRIns *newref = IR(ref2);
	  if (irt_isnum(IR(newref->op2)->t))
	    goto cselim;
	  ref2 = newref->prev;
	}
      } else {
	IRIns *key = IR(xr->op2);
	if (key->o == IR_KSLOT) key = IR(key->op1);
	if (irt_isnum(key->t) && J->chain[IR_NEWREF] > tab)
	  goto cselim;
      }
      /* NEWREF inhibits CSE for HREF, and dependent FLOADs from HREFK/AREF.
      ** But the above search for conflicting stores was limited by xref.
      ** So continue searching, limited by the TNEW/TDUP. Store forwarding
      ** is ok, too. A conflict does NOT limit the search for a matching load.
      */
      while (ref > tab) {
	IRIns *store = IR(ref);
	switch (aa_ahref(J, xr, IR(store->op1))) {
	case ALIAS_NO:   break;  /* Continue searching. */
	case ALIAS_MAY:  goto cselim;  /* Conflicting store. */
	case ALIAS_MUST: return store->op2;  /* Store forwarding. */
	}
	ref = store->prev;
      }
      /* Simplified here: let loop_unroll() figure out any type instability. */
      if (ir->o == IR_TNEW) {
	return TREF_NIL;
      } else {
	TValue keyv;
	cTValue *tv;
	IRIns *key = IR(xr->op2);
	if (key->o == IR_KSLOT) key = IR(key->op1);
	lj_ir_kvalue(J->L, &keyv, key);
	tv = lj_tab_get(J->L, ir_ktab(IR(ir->op1)), &keyv);
	if (tvispri(tv))
	  return TREF_PRI(itype2irt(tv));
	else if (tvisnum(tv))
	  return lj_ir_knum_u64(J, tv->u64);
	else if (tvisint(tv))
	  return lj_ir_kint(J, intV(tv));
	else if (tvisgcv(tv))
	  return lj_ir_kstr(J, strV(tv));
      }
      /* Othwerwise: don't intern as a constant. */
    }
  }

cselim:
  /* Try to find a matching load. Below the conflicting store, if any. */
  ref = J->chain[fins->o];
  while (ref > lim) {
    IRIns *load = IR(ref);
    if (load->op1 == xref)
      return ref;  /* Load forwarding. */
    ref = load->prev;
  }
  return 0;  /* Conflict or no match. */
}